

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

bool __thiscall mp::StringFileWriter::Open(StringFileWriter *this)

{
  bool bVar1;
  File *in_RDI;
  bool unaff_retaddr;
  function<mp::File_(bool)> *in_stack_00000008;
  File *in_stack_fffffffffffffff0;
  
  *(undefined1 *)&in_RDI[6].f_ = 1;
  std::function<mp::File_(bool)>::operator()(in_stack_00000008,unaff_retaddr);
  File::operator=(in_stack_fffffffffffffff0,in_RDI);
  File::~File((File *)0x10a552);
  bVar1 = File::operator_cast_to_bool(in_RDI + 5);
  return bVar1;
}

Assistant:

bool Open() {
    fTriedOpen_ = true;
    nm = opener_(false);
    return nm;
  }